

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

void imdct_step3_iter0_loop(int n,float *e,int i_off,int k_off,float *A)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  code *pcVar5;
  int iVar6;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  uint in_EDI;
  float *in_R8;
  float k01_21;
  float k00_20;
  SDL_AssertState sdl_assert_state;
  int i;
  float *ee2;
  float *ee0;
  int local_34;
  float *local_30;
  float *local_28;
  float *local_20;
  
  local_28 = (float *)(in_RSI + (long)in_EDX * 4);
  local_30 = local_28 + in_ECX;
  do {
    if ((in_EDI & 3) == 0) goto LAB_00142df7;
    iVar6 = SDL_ReportAssertion(&imdct_step3_iter0_loop::sdl_assert_data,"imdct_step3_iter0_loop",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/stb_vorbis.h"
                                ,0x968);
  } while (iVar6 == 0);
  if (iVar6 == 1) {
    pcVar5 = (code *)swi(3);
    (*pcVar5)();
    return;
  }
LAB_00142df7:
  local_20 = in_R8;
  for (local_34 = (int)in_EDI >> 2; 0 < local_34; local_34 = local_34 + -1) {
    fVar1 = *local_28;
    fVar2 = *local_30;
    fVar3 = local_28[-1];
    fVar4 = local_30[-1];
    *local_28 = *local_30 + *local_28;
    local_28[-1] = local_30[-1] + local_28[-1];
    *local_30 = (fVar1 - fVar2) * *local_20 + -((fVar3 - fVar4) * local_20[1]);
    local_30[-1] = (fVar3 - fVar4) * *local_20 + (fVar1 - fVar2) * local_20[1];
    fVar1 = local_28[-2];
    fVar2 = local_30[-2];
    fVar3 = local_28[-3];
    fVar4 = local_30[-3];
    local_28[-2] = local_30[-2] + local_28[-2];
    local_28[-3] = local_30[-3] + local_28[-3];
    local_30[-2] = (fVar1 - fVar2) * local_20[8] + -((fVar3 - fVar4) * local_20[9]);
    local_30[-3] = (fVar3 - fVar4) * local_20[8] + (fVar1 - fVar2) * local_20[9];
    fVar1 = local_28[-4];
    fVar2 = local_30[-4];
    fVar3 = local_28[-5];
    fVar4 = local_30[-5];
    local_28[-4] = local_30[-4] + local_28[-4];
    local_28[-5] = local_30[-5] + local_28[-5];
    local_30[-4] = (fVar1 - fVar2) * local_20[0x10] + -((fVar3 - fVar4) * local_20[0x11]);
    local_30[-5] = (fVar3 - fVar4) * local_20[0x10] + (fVar1 - fVar2) * local_20[0x11];
    fVar1 = local_28[-6];
    fVar2 = local_30[-6];
    fVar3 = local_28[-7];
    fVar4 = local_30[-7];
    local_28[-6] = local_30[-6] + local_28[-6];
    local_28[-7] = local_30[-7] + local_28[-7];
    local_30[-6] = (fVar1 - fVar2) * local_20[0x18] + -((fVar3 - fVar4) * local_20[0x19]);
    local_30[-7] = (fVar3 - fVar4) * local_20[0x18] + (fVar1 - fVar2) * local_20[0x19];
    local_20 = local_20 + 0x20;
    local_28 = local_28 + -8;
    local_30 = local_30 + -8;
  }
  return;
}

Assistant:

static void imdct_step3_iter0_loop(int n, float *e, int i_off, int k_off, float *A)
{
   float *ee0 = e + i_off;
   float *ee2 = ee0 + k_off;
   int i;

   assert((n & 3) == 0);
   for (i=(n>>2); i > 0; --i) {
      float k00_20, k01_21;
      k00_20  = ee0[ 0] - ee2[ 0];
      k01_21  = ee0[-1] - ee2[-1];
      ee0[ 0] += ee2[ 0];//ee0[ 0] = ee0[ 0] + ee2[ 0];
      ee0[-1] += ee2[-1];//ee0[-1] = ee0[-1] + ee2[-1];
      ee2[ 0] = k00_20 * A[0] - k01_21 * A[1];
      ee2[-1] = k01_21 * A[0] + k00_20 * A[1];
      A += 8;

      k00_20  = ee0[-2] - ee2[-2];
      k01_21  = ee0[-3] - ee2[-3];
      ee0[-2] += ee2[-2];//ee0[-2] = ee0[-2] + ee2[-2];
      ee0[-3] += ee2[-3];//ee0[-3] = ee0[-3] + ee2[-3];
      ee2[-2] = k00_20 * A[0] - k01_21 * A[1];
      ee2[-3] = k01_21 * A[0] + k00_20 * A[1];
      A += 8;

      k00_20  = ee0[-4] - ee2[-4];
      k01_21  = ee0[-5] - ee2[-5];
      ee0[-4] += ee2[-4];//ee0[-4] = ee0[-4] + ee2[-4];
      ee0[-5] += ee2[-5];//ee0[-5] = ee0[-5] + ee2[-5];
      ee2[-4] = k00_20 * A[0] - k01_21 * A[1];
      ee2[-5] = k01_21 * A[0] + k00_20 * A[1];
      A += 8;

      k00_20  = ee0[-6] - ee2[-6];
      k01_21  = ee0[-7] - ee2[-7];
      ee0[-6] += ee2[-6];//ee0[-6] = ee0[-6] + ee2[-6];
      ee0[-7] += ee2[-7];//ee0[-7] = ee0[-7] + ee2[-7];
      ee2[-6] = k00_20 * A[0] - k01_21 * A[1];
      ee2[-7] = k01_21 * A[0] + k00_20 * A[1];
      A += 8;
      ee0 -= 8;
      ee2 -= 8;
   }
}